

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskConstancyCase::iterate(MaskConstancyCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  float fVar3;
  byte bVar4;
  int iVar5;
  deUint32 dVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  size_t sVar10;
  Surface *surface;
  void *__buf;
  long lVar11;
  uint uVar12;
  int iVar13;
  bool *pbVar14;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  bool *pbVar19;
  uint uVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  Vec2 local_2a0;
  DefaultFBOMultisampleCase *local_298;
  Vec2 local_28c;
  Vec2 local_284;
  uint local_27c;
  float local_278;
  float local_274;
  Surface renderedImg;
  Vector<float,_4> res_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  Vector<float,_4> res_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  Vector<float,_4> res_3;
  Vector<float,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  Vec4 *c3;
  
  iVar5 = (*((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  c3 = (Vec4 *)CONCAT44(extraout_var,iVar5);
  pTVar2 = ((this->super_DefaultFBOMultisampleCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  iVar5 = (this->super_DefaultFBOMultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&renderedImg,iVar5,iVar5);
  DefaultFBOMultisampleCase::randomizeViewport(&this->super_DefaultFBOMultisampleCase);
  poVar1 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Clearing color to black",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  (**(code **)c3[0x1c].m_data)(0,0,0,0x3f800000);
  (**(code **)(c3[0x18].m_data + 2))(0x4000);
  dVar6 = (**(code **)c3[0x80].m_data)();
  glu::checkError(dVar6,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x2f5);
  if ((this->super_DefaultFBOMultisampleCase).field_0xb1 == '\x01') {
    (**(code **)c3[0x5e].m_data)(0x809e);
    (**(code **)(c3[0x23].m_data + 2))(1,1,1,0);
    dVar6 = (**(code **)c3[0x80].m_data)();
    glu::checkError(dVar6,"enable GL_SAMPLE_ALPHA_TO_COVERAGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x2fb);
    poVar1 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GL_SAMPLE_ALPHA_TO_COVERAGE is enabled",0x26);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    poVar1 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Color mask is TRUE, TRUE, TRUE, FALSE",0x25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
  }
  if ((this->super_DefaultFBOMultisampleCase).field_0xb2 == '\x01') {
    (**(code **)c3[0x5e].m_data)(0x80a0);
    dVar6 = (**(code **)c3[0x80].m_data)();
    glu::checkError(dVar6,"enable GL_SAMPLE_COVERAGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x304);
    poVar1 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GL_SAMPLE_COVERAGE is enabled",0x1d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
  }
  if ((this->super_DefaultFBOMultisampleCase).field_0xb4 == '\x01') {
    (**(code **)c3[0x5e].m_data)(0x8e51);
    dVar6 = (**(code **)c3[0x80].m_data)();
    glu::checkError(dVar6,"enable GL_SAMPLE_MASK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x30c);
    poVar1 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GL_SAMPLE_MASK is enabled",0x19);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
  }
  poVar1 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Drawing several green quads, each fully overlapped by a red quad with the same ",0x4f)
  ;
  uVar17 = (ulong)(byte)(this->super_DefaultFBOMultisampleCase).field_0xb1;
  pbVar19 = glcts::fixed_sample_locations_values + 1;
  pbVar14 = glcts::fixed_sample_locations_values + 1;
  if (uVar17 != 0) {
    pbVar14 = (bool *)0x1a1d037;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pbVar14,uVar17 * 5);
  if ((((this->super_DefaultFBOMultisampleCase).field_0xb1 == '\x01') &&
      (pbVar19 = (bool *)0x1bc4488, (this->super_DefaultFBOMultisampleCase).field_0xb2 == '\0')) &&
     (pbVar19 = glcts::fixed_sample_locations_values + 1,
     (this->super_DefaultFBOMultisampleCase).field_0xb4 != '\0')) {
    pbVar19 = (bool *)0x1bc4488;
  }
  sVar10 = strlen(pbVar19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pbVar19,sVar10);
  uVar17 = (ulong)(byte)(this->super_DefaultFBOMultisampleCase).field_0xb3;
  pcVar15 = "inverted ";
  if (uVar17 == 0) {
    pcVar15 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar15,uVar17 * 9);
  pbVar14 = (bool *)0x1c61024;
  bVar21 = (this->super_DefaultFBOMultisampleCase).field_0xb2 == '\0';
  if (bVar21) {
    pbVar14 = glcts::fixed_sample_locations_values + 1;
  }
  lVar11 = 0xf;
  if (bVar21) {
    lVar11 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pbVar14,lVar11);
  bVar4 = (this->super_DefaultFBOMultisampleCase).field_0xb4 &
          (this->super_DefaultFBOMultisampleCase).field_0xb2;
  pbVar14 = glcts::fixed_sample_locations_values + 1;
  if (bVar4 != 0) {
    pbVar14 = (bool *)0x1bc4488;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pbVar14,(ulong)bVar4 * 5);
  pcVar15 = "sample mask";
  bVar21 = (this->super_DefaultFBOMultisampleCase).field_0xb4 == '\0';
  if (bVar21) {
    pcVar15 = glcts::fixed_sample_locations_values + 1;
  }
  lVar11 = 0xb;
  if (bVar21) {
    lVar11 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar15,lVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values",7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  uVar12 = (this->super_DefaultFBOMultisampleCase).m_numSamples * 4;
  if (0 < (int)uVar12) {
    fVar22 = (float)(int)uVar12;
    local_278 = (float)(int)(uVar12 * uVar12 + -1);
    uVar17 = 0;
    local_298 = &this->super_DefaultFBOMultisampleCase;
    local_1e8 = (ulong)uVar12;
    do {
      iVar5 = (int)uVar17;
      fVar25 = (float)iVar5 / fVar22;
      local_27c = iVar5 + 1;
      fVar25 = fVar25 + fVar25 + -1.0;
      fVar27 = (float)(int)local_27c / fVar22 + (float)(int)local_27c / fVar22 + -1.0;
      local_274 = (float)iVar5 / (float)(int)(uVar12 - 1);
      local_1f0 = (ulong)(uint)(iVar5 * (int)local_1e8);
      uVar20 = 0;
      local_1e0 = uVar17;
      do {
        uVar7 = uVar20 + 1;
        if ((this->super_DefaultFBOMultisampleCase).field_0xb1 == '\0') {
          fVar23 = 1.0;
          fVar3 = 1.0;
        }
        else {
          fVar23 = (float)(int)uVar20 / (float)(int)(uVar12 - 1);
          fVar3 = local_274;
        }
        if ((this->super_DefaultFBOMultisampleCase).field_0xb2 == '\x01') {
          fVar24 = (float)(int)((int)local_1f0 + uVar20) / local_278;
          if ((this->super_DefaultFBOMultisampleCase).field_0xb3 != '\0') {
            fVar24 = 1.0 - fVar24;
          }
          (**(code **)c3[0x125].m_data)(fVar24);
          dVar6 = (**(code **)c3[0x80].m_data)();
          glu::checkError(dVar6,"glSampleCoverage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                          ,0x32f);
        }
        if ((this->super_DefaultFBOMultisampleCase).field_0xb4 == '\x01') {
          iVar5 = local_298->m_numSamples;
          uVar8 = iVar5 + 0x1e;
          if (-1 < (int)(iVar5 - 1U)) {
            uVar8 = iVar5 - 1U;
          }
          iVar5 = iVar5 - (uVar8 & 0xffffffe0);
          iVar18 = (int)uVar8 >> 5;
          iVar16 = -1;
          if (-1 < iVar18) {
            iVar16 = iVar18;
          }
          for (iVar13 = 0; iVar16 + 1 != iVar13; iVar13 = iVar13 + 1) {
            uVar8 = uVar20 << ((byte)((uint)(local_298->m_numSamples -
                                            (local_298->m_numSamples >> 0x1f)) >> 1) & 0x1f) ^
                    (uint)local_1e0;
            uVar8 = (uVar8 >> 0x10 ^ uVar8 ^ 0x3d) * 9;
            uVar9 = (uVar8 >> 4 ^ uVar8) * 0x27d4eb2d;
            uVar8 = 0xffffffff;
            if (iVar18 == iVar13) {
              uVar8 = ~(-1 << ((byte)iVar5 & 0x1f));
            }
            if (0x1f < iVar5) {
              uVar8 = 0xffffffff;
            }
            (**(code **)(c3[0x125].m_data + 2))(iVar13,uVar8 & (uVar9 >> 0xf ^ uVar9));
            dVar6 = (**(code **)c3[0x80].m_data)();
            glu::checkError(dVar6,"glSampleMaski",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                            ,0x33f);
          }
        }
        fVar24 = (float)(int)uVar20 / fVar22;
        fVar24 = fVar24 + fVar24 + -1.0;
        fVar26 = (float)(int)uVar7 / fVar22 + (float)(int)uVar7 / fVar22 + -1.0;
        res_2.m_data[3] = fVar23 + 0.0;
        res.m_data[0] = 0.0;
        res.m_data[1] = 1.0;
        res.m_data[2] = 0.0;
        res_1.m_data[3] = fVar3 + 0.0;
        res_1.m_data[0] = 0.0;
        res_1.m_data[1] = 1.0;
        res_1.m_data[2] = 0.0;
        res_2.m_data[0] = 0.0;
        res_2.m_data[1] = 1.0;
        res_2.m_data[2] = 0.0;
        res_3.m_data[0] = 0.0;
        res_3.m_data[1] = 1.0;
        res_3.m_data[2] = 0.0;
        local_2a0.m_data[0] = fVar26;
        local_2a0.m_data[1] = fVar25;
        local_28c.m_data[0] = fVar26;
        local_28c.m_data[1] = fVar27;
        local_284.m_data[0] = fVar24;
        local_284.m_data[1] = fVar27;
        res_3.m_data[3] = res_1.m_data[3];
        res.m_data[3] = res_2.m_data[3];
        DefaultFBOMultisampleCase::renderQuad
                  (local_298,&local_2a0,&local_284,&local_28c,(Vec2 *)&res,&res_1,&res_2,&res_3,c3);
        this = (MaskConstancyCase *)local_298;
        res_2.m_data[2] = 0.0;
        res_2.m_data[3] = fVar23 + 0.0;
        res.m_data[0] = 1.0;
        res.m_data[1] = 0.0;
        res_3.m_data[0] = 1.0;
        res_3.m_data[1] = 0.0;
        res_1.m_data[2] = 0.0;
        res_1.m_data[3] = fVar3 + 0.0;
        res_1.m_data[0] = 1.0;
        res_1.m_data[1] = 0.0;
        res_2.m_data[0] = 1.0;
        res_2.m_data[1] = 0.0;
        local_2a0.m_data[0] = fVar26;
        local_2a0.m_data[1] = fVar25;
        local_28c.m_data[0] = fVar26;
        local_28c.m_data[1] = fVar27;
        local_284.m_data[0] = fVar24;
        local_284.m_data[1] = fVar27;
        res_3.m_data[2] = res_1.m_data[2];
        res_3.m_data[3] = res_1.m_data[3];
        res.m_data[2] = res_2.m_data[2];
        res.m_data[3] = res_2.m_data[3];
        DefaultFBOMultisampleCase::renderQuad
                  (local_298,&local_2a0,&local_284,&local_28c,(Vec2 *)&res,&res_1,&res_2,&res_3,c3);
        uVar20 = uVar7;
      } while (uVar7 != (uint)local_1e8);
      uVar17 = (ulong)local_27c;
    } while (local_27c != (uint)local_1e8);
  }
  pbVar14 = glcts::fixed_sample_locations_values + 1;
  DefaultFBOMultisampleCase::readImage(&this->super_DefaultFBOMultisampleCase,&renderedImg);
  res_1.m_data._0_8_ = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&res_1,"RenderedImage","");
  res_2.m_data._0_8_ = &local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&res_2,"Rendered image","");
  surface = &renderedImg;
  tcu::LogImage::LogImage
            ((LogImage *)&res,(string *)&res_1,(string *)&res_2,surface,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::LogImage::write((LogImage *)&res,(int)pTVar2,__buf,(size_t)surface);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != local_188) {
    operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != &local_1a8) {
    operator_delete((void *)res.m_data._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_2.m_data._0_8_ != &local_228) {
    operator_delete((void *)res_2.m_data._0_8_,local_228._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_1.m_data._0_8_ != &local_208) {
    operator_delete((void *)res_1.m_data._0_8_,local_208._M_allocated_capacity + 1);
  }
  if (0 < renderedImg.m_height) {
    iVar5 = 0;
    iVar16 = 0;
    do {
      uVar17 = (ulong)(uint)renderedImg.m_width;
      iVar18 = iVar5;
      if (0 < renderedImg.m_width) {
        do {
          if (*(char *)((long)renderedImg.m_pixels.m_ptr + (long)iVar18 * 4 + 1) != '\0') {
            poVar1 = (ostringstream *)(res.m_data + 2);
            res.m_data._0_8_ = pTVar2;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "Failure: Non-zero green color component detected - should have been completely overwritten by red quad"
                       ,0x66);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_140);
            tcu::TestContext::setTestResult
                      (((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_testCtx
                       ,QP_TEST_RESULT_FAIL,"Failed");
            goto LAB_0152a153;
          }
          iVar18 = iVar18 + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      iVar16 = iVar16 + 1;
      iVar5 = iVar5 + renderedImg.m_width;
    } while (iVar16 != renderedImg.m_height);
  }
  poVar1 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Success: Coverage mask appears to be constant at a given pixel coordinate with a given "
             ,0x57);
  pbVar19 = (bool *)0x1a1d037;
  if ((ulong)(byte)(this->super_DefaultFBOMultisampleCase).field_0xb1 == 0) {
    pbVar19 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pbVar19,
             (ulong)(byte)(this->super_DefaultFBOMultisampleCase).field_0xb1 * 5);
  bVar4 = (this->super_DefaultFBOMultisampleCase).field_0xb2 &
          (this->super_DefaultFBOMultisampleCase).field_0xb1;
  pbVar19 = (bool *)0x1bc4488;
  if (bVar4 == 0) {
    pbVar19 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pbVar19,(ulong)bVar4 * 5);
  bVar21 = (this->super_DefaultFBOMultisampleCase).field_0xb2 != '\0';
  if (bVar21) {
    pbVar14 = (bool *)0x1bc5be2;
  }
  lVar11 = 0xe;
  if (!bVar21) {
    lVar11 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pbVar14,lVar11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  tcu::TestContext::setTestResult
            (((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_testCtx,
             QP_TEST_RESULT_PASS,"Passed");
LAB_0152a153:
  tcu::Surface::~Surface(&renderedImg);
  return STOP;
}

Assistant:

MaskConstancyCase::IterateResult MaskConstancyCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	TestLog&				log				= m_testCtx.getLog();
	tcu::Surface			renderedImg		(m_viewportSize, m_viewportSize);

	randomizeViewport();

	log << TestLog::Message << "Clearing color to black" << TestLog::EndMessage;
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	if (m_isAlphaToCoverageCase)
	{
		gl.enable(GL_SAMPLE_ALPHA_TO_COVERAGE);
		gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_ALPHA_TO_COVERAGE");

		log << TestLog::Message << "GL_SAMPLE_ALPHA_TO_COVERAGE is enabled" << TestLog::EndMessage;
		log << TestLog::Message << "Color mask is TRUE, TRUE, TRUE, FALSE" << TestLog::EndMessage;
	}

	if (m_isSampleCoverageCase)
	{
		gl.enable(GL_SAMPLE_COVERAGE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_COVERAGE");

		log << TestLog::Message << "GL_SAMPLE_COVERAGE is enabled" << TestLog::EndMessage;
	}

	if (m_isSampleMaskCase)
	{
		gl.enable(GL_SAMPLE_MASK);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_MASK");

		log << TestLog::Message << "GL_SAMPLE_MASK is enabled" << TestLog::EndMessage;
	}

	log << TestLog::Message
		<< "Drawing several green quads, each fully overlapped by a red quad with the same "
		<< (m_isAlphaToCoverageCase ? "alpha" : "")
		<< (m_isAlphaToCoverageCase && (m_isSampleCoverageCase || m_isSampleMaskCase) ? " and " : "")
		<< (m_isInvertedSampleCoverageCase ? "inverted " : "")
		<< (m_isSampleCoverageCase ? "sample coverage" : "")
		<< (m_isSampleCoverageCase && m_isSampleMaskCase ? " and " : "")
		<< (m_isSampleMaskCase ? "sample mask" : "")
		<< " values"
		<< TestLog::EndMessage;

	const int numQuadRowsCols = m_numSamples*4;

	for (int row = 0; row < numQuadRowsCols; row++)
	{
		for (int col = 0; col < numQuadRowsCols; col++)
		{
			float		x0			= (float)(col+0) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		x1			= (float)(col+1) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		y0			= (float)(row+0) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		y1			= (float)(row+1) / (float)numQuadRowsCols * 2.0f - 1.0f;
			const Vec4	baseGreen	(0.0f, 1.0f, 0.0f, 0.0f);
			const Vec4	baseRed		(1.0f, 0.0f, 0.0f, 0.0f);
			Vec4		alpha0		(0.0f, 0.0f, 0.0f, m_isAlphaToCoverageCase ? (float)col / (float)(numQuadRowsCols-1) : 1.0f);
			Vec4		alpha1		(0.0f, 0.0f, 0.0f, m_isAlphaToCoverageCase ? (float)row / (float)(numQuadRowsCols-1) : 1.0f);

			if (m_isSampleCoverageCase)
			{
				float value = (float)(row*numQuadRowsCols + col) / (float)(numQuadRowsCols*numQuadRowsCols-1);
				gl.sampleCoverage(m_isInvertedSampleCoverageCase ? 1.0f - value : value, m_isInvertedSampleCoverageCase ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleCoverage");
			}

			if (m_isSampleMaskCase)
			{
				const int			wordCount		= getEffectiveSampleMaskWordCount(m_numSamples - 1);
				const GLbitfield	finalWordBits	= m_numSamples - 32 * ((m_numSamples-1) / 32);
				const GLbitfield	finalWordMask	= (GLbitfield)deBitMask32(0, (int)finalWordBits);

				for (int wordNdx = 0; wordNdx < wordCount; ++wordNdx)
				{
					const GLbitfield	mask		= (GLbitfield)deUint32Hash((col << (m_numSamples / 2)) ^ row);
					const bool			isFinalWord	= (wordNdx + 1) == wordCount;
					const GLbitfield	maskMask	= (isFinalWord) ? (finalWordMask) : (0xFFFFFFFFUL); // maskMask prevents setting coverage bits higher than sample count

					gl.sampleMaski(wordNdx, mask & maskMask);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleMaski");
				}
			}

			renderQuad(Vec2(x0, y0), Vec2(x1, y0), Vec2(x0, y1), Vec2(x1, y1), baseGreen + alpha0,	baseGreen + alpha1,	baseGreen + alpha0,	baseGreen + alpha1);
			renderQuad(Vec2(x0, y0), Vec2(x1, y0), Vec2(x0, y1), Vec2(x1, y1), baseRed + alpha0,	baseRed + alpha1,	baseRed + alpha0,	baseRed + alpha1);
		}
	}

	readImage(renderedImg);

	log << TestLog::Image("RenderedImage", "Rendered image", renderedImg, QP_IMAGE_COMPRESSION_MODE_PNG);

	for (int y = 0; y < renderedImg.getHeight(); y++)
	for (int x = 0; x < renderedImg.getWidth(); x++)
	{
		if (renderedImg.getPixel(x, y).getGreen() > 0)
		{
			log << TestLog::Message << "Failure: Non-zero green color component detected - should have been completely overwritten by red quad" << TestLog::EndMessage;
			m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
			return STOP;
		}
	}

	log << TestLog::Message
		<< "Success: Coverage mask appears to be constant at a given pixel coordinate with a given "
		<< (m_isAlphaToCoverageCase ? "alpha" : "")
		<< (m_isAlphaToCoverageCase && m_isSampleCoverageCase ? " and " : "")
		<< (m_isSampleCoverageCase ? "coverage value" : "")
		<< TestLog::EndMessage;

	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");

	return STOP;
}